

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::
ItemSimilarityRecommender_SimilarItems
          (ItemSimilarityRecommender_SimilarItems *this,ItemSimilarityRecommender_SimilarItems *from
          )

{
  void *pvVar1;
  double dVar2;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_SimilarItems_0070a208;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->similaritemlist_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->similaritemlist_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->similaritemlist_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->similaritemlist_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::TypeHandler>
            (&(this->similaritemlist_).super_RepeatedPtrFieldBase,
             &(from->similaritemlist_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  dVar2 = from->itemscoreadjustment_;
  this->itemid_ = from->itemid_;
  this->itemscoreadjustment_ = dVar2;
  return;
}

Assistant:

ItemSimilarityRecommender_SimilarItems::ItemSimilarityRecommender_SimilarItems(const ItemSimilarityRecommender_SimilarItems& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      similaritemlist_(from.similaritemlist_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&itemid_, &from.itemid_,
    reinterpret_cast<char*>(&itemscoreadjustment_) -
    reinterpret_cast<char*>(&itemid_) + sizeof(itemscoreadjustment_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ItemSimilarityRecommender.SimilarItems)
}